

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O3

void __thiscall SRUP_Crypto::_encrypt(SRUP_Crypto *this,char *__block,int __edflag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  EVP_PKEY *pkey_00;
  EVP_CIPHER_CTX *ctx;
  EVP_CIPHER *pEVar6;
  int *piVar7;
  void *in_RCX;
  EVP_PKEY *pkey;
  int final_len;
  int body_len;
  int evp_key_len;
  uint8_t iv [16];
  uint8_t final [4096];
  uint8_t body [4096];
  EVP_PKEY *local_2080;
  uchar *local_2078;
  uint local_206c;
  uint local_2068;
  int local_2064;
  ulong local_2060;
  ulong local_2058;
  ulong local_2050;
  uchar local_2048 [16];
  uchar local_2038 [4096];
  uchar local_1038 [4104];
  
  pkey_00 = EVP_PKEY_new();
  local_2080 = pkey_00;
  iVar3 = EVP_PKEY_assign(pkey_00,6,in_RCX);
  if (iVar3 == 0) {
    EVP_PKEY_free(pkey_00);
  }
  else {
    ctx = EVP_CIPHER_CTX_new();
    EVP_CIPHER_CTX_reset(ctx);
    iVar4 = EVP_PKEY_get_size(pkey_00);
    iVar3 = -1;
    if (-1 < iVar4) {
      iVar3 = iVar4;
    }
    local_2078 = (uchar *)operator_new__((long)iVar3);
    pEVar6 = EVP_aes_256_cbc();
    iVar3 = EVP_SealInit(ctx,pEVar6,&local_2078,&local_2064,local_2048,&local_2080,1);
    if (((iVar3 == 0) ||
        (iVar3 = EVP_EncryptUpdate(ctx,local_1038,(int *)&local_2068,(uchar *)__block,__edflag),
        iVar3 == 0)) || (iVar3 = EVP_SealFinal(ctx,local_2038,(int *)&local_206c), iVar3 == 0)) {
      EVP_PKEY_free(local_2080);
      EVP_CIPHER_CTX_free(ctx);
      if (local_2078 != (uchar *)0x0) {
        operator_delete__(local_2078);
      }
    }
    else {
      pEVar6 = EVP_aes_256_cbc();
      iVar4 = EVP_CIPHER_get_iv_length(pEVar6);
      uVar5 = iVar4 + local_2064 + local_2068 + local_206c + 0xc;
      this->m_crypt_length = (uint16_t)uVar5;
      iVar3 = local_2064;
      if (this->m_crypt != (uint8_t *)0x0) {
        operator_delete__(this->m_crypt);
        uVar5 = (uint)this->m_crypt_length;
        iVar3 = local_2064;
      }
      local_2060 = (ulong)local_2068;
      local_2058 = (ulong)local_206c;
      piVar7 = (int *)operator_new__((ulong)(uVar5 & 0xffff));
      this->m_crypt = (uint8_t *)piVar7;
      *piVar7 = iVar3;
      memcpy(piVar7 + 1,local_2078,(long)iVar3);
      local_2050 = (ulong)(uint)(iVar3 + iVar4);
      memcpy((uint8_t *)((long)piVar7 + (long)iVar3 + 4U),local_2048,(long)iVar4);
      iVar1 = (int)local_2058;
      iVar2 = (int)local_2060;
      *(int *)((long)piVar7 + (long)(iVar3 + iVar4 + 4)) = iVar1 + iVar2;
      *(int *)((long)piVar7 + (long)(iVar3 + 8 + iVar4)) = __edflag;
      memcpy((uint8_t *)((long)(iVar3 + iVar4 + 0xc) + (long)piVar7),local_1038,(long)iVar2);
      memcpy((uint8_t *)((long)((int)local_2050 + iVar2 + 0xc) + (long)piVar7),local_2038,
             (long)iVar1);
      EVP_PKEY_free(local_2080);
      EVP_CIPHER_CTX_free(ctx);
      if (local_2078 != (uchar *)0x0) {
        operator_delete__(local_2078);
      }
    }
  }
  return;
}

Assistant:

bool SRUP_Crypto::_encrypt(uint8_t *data, int input_datasize, RSA *rsa_key)
{
    int evp_key_len;
    int iv_len;

    uint8_t body[4096];
    int body_len;

    uint8_t final[4096];
    int final_len;

    uint8_t* evp_key = nullptr;
    uint8_t iv[EVP_MAX_IV_LENGTH];

    EVP_PKEY *pkey;
    EVP_CIPHER_CTX* ctx;

    pkey = EVP_PKEY_new();

    // Next we need to assign the "envelope key" & init...
    if (!EVP_PKEY_assign_RSA(pkey, rsa_key))
    {
        EVP_PKEY_free(pkey);
        return false;
    }

    ctx = EVP_CIPHER_CTX_new();

    EVP_CIPHER_CTX_init(ctx);
    evp_key = new uint8_t[EVP_PKEY_size(pkey)];
    if (!EVP_SealInit(ctx, EVP_aes_256_cbc(), &evp_key, &evp_key_len, iv, &pkey, 1))
    {
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        delete[] evp_key;
        return false;
    }

    // Having initialized (generated the initialization vector (iv) and the symmetric key we next do the encryption
    if (!EVP_SealUpdate(ctx, body, &body_len, data, input_datasize))
    {
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        delete[] evp_key;
        return false;
    }

    // We finish with EVP_SealFinal to take care of any padding
    if (!EVP_SealFinal(ctx, final, &final_len))
    {
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        delete[] evp_key;
        return false;
    }

    // Lastly we need to write the encrypted (symmetric) key length, the encrypted (symmetric) key; and the
    // initialization vector to the return value...along with the encrypted version of the data.

    // We start by calculating the size of the return value.
    iv_len = EVP_CIPHER_iv_length(EVP_aes_256_cbc());

    // The crypt length is equal to:
    // key length (sizeof(int)=4) + key length + IV length + data size (sizeof(int)=4)) +
    // input data size (sizeof(int)=4)) + data (body + final (including padding))
    m_crypt_length = sizeof(int) + evp_key_len + iv_len + sizeof(int) + sizeof(int) + body_len + final_len;

    delete[] m_crypt;
    m_crypt = new uint8_t[m_crypt_length];

    int x=0;

    // Now we're ready to write the encrypted data to m_crypt...
    // The order here is:
    //
    // encrypted (symmetric) key length
    std::memcpy(m_crypt, &evp_key_len, sizeof(int));
    x+=sizeof(int);

    // encrypted (symmetric) key
    std::memcpy(m_crypt+x, evp_key, (size_t) evp_key_len);
    x+=evp_key_len;

    // initialization vector (this has a fixed length – so we don't need to store it)
    std::memcpy(m_crypt+x, iv, (size_t) iv_len);
    x+=iv_len;

    // encrypted data size
    int encrypted_data_size = body_len + final_len;
    std::memcpy(m_crypt+x, &encrypted_data_size, sizeof(int));
    x+=sizeof(int);

    // Now the unencrypted data size (so we can reconstruct the data on the other side)
    std::memcpy(m_crypt+x, &input_datasize, sizeof(int));
    x+=sizeof(int);

    // And finally the encrypted data – first the main block of encrypted data...
    std::memcpy(m_crypt+x, body, (size_t) body_len);
    x+=body_len;

    // ...then the final data block (including any padding)
    // NOTE: this rather assumes that we'll never get data larger than 128-bytes. We'll need to change this if we're
    // expecting that not to be the case.
    std::memcpy(m_crypt+x, final, (size_t) final_len);

    EVP_PKEY_free(pkey);
    EVP_CIPHER_CTX_free(ctx);
    delete[] evp_key;

    return true;
}